

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

TestBuilder * __thiscall
anon_unknown.dwarf_f383c3::TestBuilder::Push(TestBuilder *this,CPubKey *pubkey)

{
  byte bVar1;
  long lVar2;
  long in_FS_OFFSET;
  allocator_type local_31;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pubkey->vch[0] & 0xfe) == 2) {
    lVar2 = 0x21;
  }
  else {
    bVar1 = pubkey->vch[0] - 4;
    if (bVar1 < 4) {
      lVar2 = *(long *)(&DAT_00b5ace0 + (ulong)bVar1 * 8);
    }
    else {
      lVar2 = 0;
    }
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_30,pubkey->vch,
             pubkey->vch + lVar2,&local_31);
  DoPush(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

TestBuilder& Push(const CPubKey& pubkey)
    {
        DoPush(std::vector<unsigned char>(pubkey.begin(), pubkey.end()));
        return *this;
    }